

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  sunrealtype w;
  sunrealtype v;
  sunrealtype u;
  sunrealtype ep;
  sunrealtype *rdata;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix J_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = **(double **)((long)y->content + 0x10);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar4 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  *(double *)**(undefined8 **)((long)J->content + 0x20) = dVar2 * 2.0 * dVar3 + -(dVar4 + 1.0);
  **(double **)(*(long *)((long)J->content + 0x20) + 8) = dVar2 * dVar2;
  **(double **)(*(long *)((long)J->content + 0x20) + 0x10) = -dVar2;
  *(double *)(**(long **)((long)J->content + 0x20) + 8) = -(dVar2 * 2.0) * dVar3 + dVar4;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 8) = -dVar2 * dVar2;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 8) = dVar2;
  *(double *)(**(long **)((long)J->content + 0x20) + 0x10) = -dVar4;
  *(undefined8 *)(*(long *)(*(long *)((long)J->content + 0x20) + 8) + 0x10) = 0;
  *(double *)(*(long *)(*(long *)((long)J->content + 0x20) + 0x10) + 0x10) = -1.0 / dVar1 - dVar2;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype ep = rdata[2];                    /* access data entries */
  sunrealtype u  = NV_Ith_S(y, 0);              /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);
  sunrealtype w  = NV_Ith_S(y, 2);

  /* fill in the Jacobian via SUNDenseMatrix macro, SM_ELEMENT_D (see sunmatrix_dense.h) */
  SM_ELEMENT_D(J, 0, 0) = -(w + 1.0) + 2.0 * u * v;
  SM_ELEMENT_D(J, 0, 1) = u * u;
  SM_ELEMENT_D(J, 0, 2) = -u;

  SM_ELEMENT_D(J, 1, 0) = w - 2.0 * u * v;
  SM_ELEMENT_D(J, 1, 1) = -u * u;
  SM_ELEMENT_D(J, 1, 2) = u;

  SM_ELEMENT_D(J, 2, 0) = -w;
  SM_ELEMENT_D(J, 2, 1) = 0.0;
  SM_ELEMENT_D(J, 2, 2) = -1.0 / ep - u;

  return 0; /* Return with success */
}